

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

int Kit_TruthVarsAntiSymm(uint *pTruth,int nVars,int iVar0,int iVar1,uint *pCof0,uint *pCof1)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  if (pCof0 == (uint *)0x0) {
    if (10 < nVars) {
      __assert_fail("nVars <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                    ,0x4cc,
                    "int Kit_TruthVarsAntiSymm(unsigned int *, int, int, int, unsigned int *, unsigned int *)"
                   );
    }
    pCof0 = Kit_TruthVarsAntiSymm::uTemp0;
  }
  if (pCof1 == (uint *)0x0) {
    if (10 < nVars) {
      __assert_fail("nVars <= 10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                    ,0x4d1,
                    "int Kit_TruthVarsAntiSymm(unsigned int *, int, int, int, unsigned int *, unsigned int *)"
                   );
    }
    pCof1 = Kit_TruthVarsAntiSymm::uTemp1;
  }
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    Kit_TruthCofactor0(pCof0,nVars,iVar0);
    Kit_TruthCofactor0(pCof0,nVars,iVar1);
  }
  else {
    lVar3 = uVar4 + 1;
    do {
      pCof0[lVar3 + -2] = pTruth[lVar3 + -2];
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
    Kit_TruthCofactor0(pCof0,nVars,iVar0);
    Kit_TruthCofactor0(pCof0,nVars,iVar1);
    if (0 < (int)uVar1) {
      lVar3 = uVar4 + 1;
      do {
        pCof1[lVar3 + -2] = pTruth[lVar3 + -2];
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
  }
  Kit_TruthCofactor1(pCof1,nVars,iVar0);
  Kit_TruthCofactor1(pCof1,nVars,iVar1);
  do {
    if ((int)uVar4 < 1) {
      return 1;
    }
    lVar3 = uVar4 - 1;
    lVar2 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pCof0[lVar3] == pCof1[lVar2]);
  return 0;
}

Assistant:

int Kit_TruthVarsAntiSymm( unsigned * pTruth, int nVars, int iVar0, int iVar1, unsigned * pCof0, unsigned * pCof1 )
{
    static unsigned uTemp0[32], uTemp1[32];
    if ( pCof0 == NULL )
    {
        assert( nVars <= 10 );
        pCof0 = uTemp0;
    }
    if ( pCof1 == NULL )
    {
        assert( nVars <= 10 );
        pCof1 = uTemp1;
    }
    // compute Cof00
    Kit_TruthCopy( pCof0, pTruth, nVars );
    Kit_TruthCofactor0( pCof0, nVars, iVar0 );
    Kit_TruthCofactor0( pCof0, nVars, iVar1 );
    // compute Cof11
    Kit_TruthCopy( pCof1, pTruth, nVars );
    Kit_TruthCofactor1( pCof1, nVars, iVar0 );
    Kit_TruthCofactor1( pCof1, nVars, iVar1 );
    // compare
    return Kit_TruthIsEqual( pCof0, pCof1, nVars );
}